

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ocsp_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  bool bVar4;
  
  ssl = hs->ssl;
  uVar2 = ssl_protocol_version(ssl);
  bVar4 = true;
  if (((uVar2 < 0x304) && ((hs->field_0x6c8 & 0x80) != 0)) && ((ssl->s3->field_0xdc & 0x20) == 0)) {
    bVar1 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
    if ((bVar1) &&
       ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
        *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
         &(((hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
            _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)->ocsp_response)._M_t.
          super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> !=
        (crypto_buffer_st *)0x0)) {
      hs->field_0x6c8 = hs->field_0x6c8 | 0x40;
      iVar3 = CBB_add_u16(out,5);
      if (iVar3 == 0) {
        bVar4 = false;
      }
      else {
        iVar3 = CBB_add_u16(out,0);
        bVar4 = iVar3 != 0;
      }
    }
  }
  return bVar4;
}

Assistant:

static bool ext_ocsp_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||
      !hs->ocsp_stapling_requested || ssl->s3->session_reused ||
      !ssl_cipher_uses_certificate_auth(hs->new_cipher) ||
      hs->credential->ocsp_response == nullptr) {
    return true;
  }

  hs->certificate_status_expected = true;

  return CBB_add_u16(out, TLSEXT_TYPE_status_request) &&
         CBB_add_u16(out, 0 /* length */);
}